

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::executeInitializationOperations(CoreBroker *this,bool iterating)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  anon_class_16_2_3f4df027 F;
  string_view newFederate;
  bool bVar1;
  __int_type _Var2;
  int iVar3;
  pointer pBVar4;
  byte in_SIL;
  CoreBroker *in_RDI;
  MessageProcessingResult res;
  ActionMessage init;
  ActionMessage wMiss;
  ActionMessage eMiss_1;
  string errorString;
  ActionMessage eMiss;
  int unmatchedCount;
  BasicHandleInfo *info_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_3;
  iterator __end3_3;
  iterator __begin3_3;
  value_type *__range3_3;
  BasicHandleInfo *info_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_2;
  iterator __end3_2;
  iterator __begin3_2;
  value_type *__range3_2;
  BasicHandleInfo *info_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  BasicHandleInfo *info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  bool useRegex;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  foundAliasHandles;
  ActionMessage init_1;
  ActionMessage *in_stack_fffffffffffff648;
  UnknownHandleManager *in_stack_fffffffffffff650;
  BrokerBase *in_stack_fffffffffffff658;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
  *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  action_t in_stack_fffffffffffff66c;
  HandleManager *in_stack_fffffffffffff670;
  ActionMessage *in_stack_fffffffffffff678;
  CoreBroker *in_stack_fffffffffffff680;
  ActionMessage *in_stack_fffffffffffff688;
  CoreBroker *in_stack_fffffffffffff690;
  UnknownHandleManager *in_stack_fffffffffffff6b0;
  UnknownHandleManager *in_stack_fffffffffffff6b8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
  *in_stack_fffffffffffff6c8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
  *cfunc;
  UnknownHandleManager *in_stack_fffffffffffff6d0;
  UnknownHandleManager *this_00;
  HandleManager *in_stack_fffffffffffff738;
  action_t disconnectType;
  CoreBroker *in_stack_fffffffffffff740;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
  *cfunc_00;
  UnknownHandleManager *this_01;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
  *cfunc_01;
  UnknownHandleManager *this_02;
  GlobalFederateId local_880;
  char local_879;
  BaseType local_878;
  GlobalFederateId local_874 [3];
  BaseType local_868;
  undefined1 in_stack_fffffffffffff7ab;
  int in_stack_fffffffffffff7ac;
  BrokerBase *in_stack_fffffffffffff7b0;
  string_view in_stack_fffffffffffff7b8;
  GlobalFederateId in_stack_fffffffffffff7cc;
  undefined1 local_7a8 [56];
  Time in_stack_fffffffffffff890;
  Time in_stack_fffffffffffff898;
  Time in_stack_fffffffffffff8a0;
  string_view in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff900;
  _Alloc_hider in_stack_fffffffffffff908;
  CoreBroker *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  InterfaceHandle local_60c [3];
  GlobalFederateId *local_600;
  BaseType local_5d8;
  GlobalFederateId local_5d4;
  GlobalFederateId local_5d0;
  undefined4 in_stack_fffffffffffffa34;
  undefined1 firstLoad;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  char *in_stack_fffffffffffffa48;
  _Alloc_hider in_stack_fffffffffffffa90;
  BasicHandleInfo *in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  InterfaceHandle local_454;
  __sv_type local_450;
  __sv_type local_440;
  undefined4 local_430;
  GlobalFederateId local_42c [3];
  __node_base local_420;
  int *local_418;
  _Hash_node_base *local_3f0;
  int *local_3e8;
  allocator<char> local_3b9;
  _Hash_node_base local_3b8 [4];
  BaseType local_398;
  GlobalFederateId local_394 [2];
  undefined4 local_38c;
  float local_388;
  undefined4 local_37c;
  int local_2d8 [20];
  __sv_type local_288;
  BasicHandleInfo *local_278;
  reference local_270;
  __node_base local_268;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  reference local_258;
  __sv_type local_250;
  BasicHandleInfo *local_240;
  reference local_238;
  __node_base local_230;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  reference local_220;
  __sv_type local_218;
  BasicHandleInfo *local_208;
  reference local_200;
  __node_base local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  reference local_1e8;
  __sv_type local_1e0;
  CoreBroker *local_1d0;
  reference local_1c8;
  __node_base local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  reference local_1b0;
  __node_base in_stack_fffffffffffffe60;
  undefined1 local_168 [64];
  basic_string_view<char,_std::char_traits<char>_> local_128;
  __node_base local_118;
  UnknownHandleManager *local_110;
  __sv_type local_108;
  BaseType local_f8;
  GlobalFederateId local_f4;
  ActionMessage *local_f0;
  float local_d0;
  GlobalFederateId local_cc;
  ActionMessage local_c8;
  byte local_9;
  
  firstLoad = SUB41(in_stack_fffffffffffffa34,3);
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
    local_d0 = (float)(in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_cc,(GlobalBrokerId)local_d0);
    local_c8.source_id.gid = local_cc.gid;
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,iteration_requested_flag);
    BrokerBase::setBrokerState
              (in_stack_fffffffffffff658,(BrokerState)((ulong)in_stack_fffffffffffff650 >> 0x30));
    local_f0 = &local_c8;
    F.this = in_stack_fffffffffffff690;
    F.init = in_stack_fffffffffffff688;
    gmlc::containers::
    DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
    ::apply<helics::CoreBroker::executeInitializationOperations(bool)::__8>
              ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
                *)in_stack_fffffffffffff680,F);
    (in_RDI->super_BrokerBase).field_0x296 = 0;
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
    return;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff650,(char *)in_stack_fffffffffffff648);
  if ((bVar1) &&
     (_Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffff658), 5 < _Var2)) {
    local_f8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_f4,(GlobalBrokerId)local_f8);
    getIdentifier_abi_cxx11_(in_RDI);
    local_108 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff650);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff660,
               (char *)in_stack_fffffffffffff658);
    BrokerBase::sendToLogger
              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7ac,
               in_stack_fffffffffffff7b8,in_stack_fffffffffffff8f0,(bool)in_stack_fffffffffffff7ab);
    in_stack_fffffffffffff648 = (ActionMessage *)local_118._M_nxt;
    in_stack_fffffffffffff650 = local_110;
  }
  checkDependencies((CoreBroker *)in_stack_fffffffffffffe60._M_nxt);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e9033);
  if (!bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128);
    newFederate._M_len._4_4_ = in_stack_fffffffffffffa44;
    newFederate._M_len._0_4_ = in_stack_fffffffffffffa40;
    newFederate._M_str = in_stack_fffffffffffffa48;
    loadTimeMonitor((CoreBroker *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                    (bool)firstLoad,newFederate);
  }
  bVar1 = UnknownHandleManager::hasUnknowns(in_stack_fffffffffffff650);
  if (!bVar1) goto LAB_005e9fd7;
  cfunc_01 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
              *)&in_RDI->unknownHandles;
  this_02 = (UnknownHandleManager *)(local_168 + 0x20);
  std::
  function<void(std::__cxx11::string_const&,helics::InterfaceType,std::__cxx11::string_const&,helics::InterfaceType)>
  ::function<helics::CoreBroker::executeInitializationOperations(bool)::__0,void>
            (in_stack_fffffffffffff660,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff658);
  UnknownHandleManager::processUnknownLinks(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  CLI::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
               *)0x5e90e6);
  this_01 = (UnknownHandleManager *)local_168;
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)0x5e90fb);
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)in_stack_fffffffffffff670,
           CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  cfunc_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
              *)&in_RDI->unknownHandles;
  std::
  function<void(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>
  ::function<helics::CoreBroker::executeInitializationOperations(bool)::__1,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
              *)in_stack_fffffffffffff660,(anon_class_24_3_9dcf7976 *)in_stack_fffffffffffff658);
  UnknownHandleManager::processUnknowns(this_01,cfunc_00);
  CLI::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
               *)0x5e9194);
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_168,0);
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff660);
  if (!bVar1) {
    local_1b0 = CLI::std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_168,0);
    local_1b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff648);
    local_1c0._M_nxt =
         (_Hash_node_base *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff648);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff650,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff648), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1c8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1b8);
      in_stack_fffffffffffff738 = &in_RDI->handles;
      local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      name._M_str = (char *)in_stack_fffffffffffff680;
      name._M_len = (size_t)in_stack_fffffffffffff678;
      in_stack_fffffffffffff740 =
           (CoreBroker *)
           HandleManager::getInterfaceHandle
                     (in_stack_fffffffffffff670,name,
                      (InterfaceType)((uint)in_stack_fffffffffffff66c >> 0x18));
      local_1d0 = in_stack_fffffffffffff740;
      findAndNotifyPublicationTargets
                ((CoreBroker *)in_stack_fffffffffffff980,
                 (BasicHandleInfo *)in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1b8);
    }
  }
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_168,1);
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff660);
  if (!bVar1) {
    local_1e8 = CLI::std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_168,1);
    local_1f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff648);
    local_1f8._M_nxt =
         (_Hash_node_base *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff648);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff650,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff648), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_200 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1f0);
      local_218 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      name_00._M_str = (char *)in_stack_fffffffffffff680;
      name_00._M_len = (size_t)in_stack_fffffffffffff678;
      local_208 = HandleManager::getInterfaceHandle
                            (in_stack_fffffffffffff670,name_00,
                             (InterfaceType)((uint)in_stack_fffffffffffff66c >> 0x18));
      findAndNotifyInputTargets
                (in_stack_fffffffffffff910,(BasicHandleInfo *)in_stack_fffffffffffff908._M_p,
                 (string *)in_stack_fffffffffffff900);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1f0);
    }
  }
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_168,2);
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff660);
  if (!bVar1) {
    local_220 = CLI::std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_168,2);
    local_228._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff648);
    local_230._M_nxt =
         (_Hash_node_base *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff648);
    while (bVar1 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff650,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff648), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_238 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_228);
      local_250 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      name_01._M_str = (char *)in_stack_fffffffffffff680;
      name_01._M_len = (size_t)in_stack_fffffffffffff678;
      local_240 = HandleManager::getInterfaceHandle
                            (in_stack_fffffffffffff670,name_01,
                             (InterfaceType)((uint)in_stack_fffffffffffff66c >> 0x18));
      findAndNotifyEndpointTargets
                ((CoreBroker *)in_stack_fffffffffffff8a0.internalTimeCode,
                 (BasicHandleInfo *)in_stack_fffffffffffff898.internalTimeCode,
                 (string *)in_stack_fffffffffffff890.internalTimeCode);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_228);
    }
  }
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_168,3);
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff660);
  disconnectType = (action_t)((ulong)in_stack_fffffffffffff738 >> 0x20);
  if (!bVar1) {
    local_258 = CLI::std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_168,3);
    local_260._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff648);
    local_268._M_nxt =
         (_Hash_node_base *)
         CLI::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff648);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff650,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff648);
      disconnectType = (action_t)((ulong)in_stack_fffffffffffff738 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_270 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_260);
      local_288 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      name_02._M_str = (char *)in_stack_fffffffffffff680;
      name_02._M_len = (size_t)in_stack_fffffffffffff678;
      local_278 = HandleManager::getInterfaceHandle
                            (in_stack_fffffffffffff670,name_02,
                             (InterfaceType)((uint)in_stack_fffffffffffff66c >> 0x18));
      findAndNotifyFilterTargets
                ((CoreBroker *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (string *)in_stack_fffffffffffffa90._M_p);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_260);
    }
  }
  if ((((in_RDI->super_BrokerBase).errorOnUnmatchedConnections & 1U) == 0) ||
     (bVar1 = UnknownHandleManager::hasUnknowns(in_stack_fffffffffffff650), !bVar1)) {
LAB_005e9c62:
    bVar1 = UnknownHandleManager::hasNonOptionalUnknowns(in_stack_fffffffffffff6b8);
    if (bVar1) {
      bVar1 = UnknownHandleManager::hasRequiredUnknowns(in_stack_fffffffffffff6b0);
      if (bVar1) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
        local_5d8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_5d4,(GlobalBrokerId)local_5d8);
        local_600 = &local_5d0;
        std::
        function<void(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>
        ::function<helics::CoreBroker::executeInitializationOperations(bool)::__6,void>
                  ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                    *)in_stack_fffffffffffff660,
                   (anon_class_16_2_f7ad1fee *)in_stack_fffffffffffff658);
        UnknownHandleManager::processRequiredUnknowns(this_02,cfunc_01);
        CLI::std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
        ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                     *)0x5e9d6a);
        SmallBuffer::operator=
                  ((SmallBuffer *)in_stack_fffffffffffff678,(char (*) [29])in_stack_fffffffffffff670
                  );
        local_60c[0].hid = 0;
        InterfaceHandle::InterfaceHandle(local_60c);
        broadcast(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
        sendDisconnect(in_stack_fffffffffffff740,disconnectType);
        ActionMessage::ActionMessage
                  ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
        BrokerBase::addActionMessage
                  ((BrokerBase *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
        bVar1 = true;
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
        goto LAB_005e9fa4;
      }
      ActionMessage::ActionMessage
                ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
      local_7a8._32_4_ = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)(local_7a8 + 0x24),(GlobalBrokerId)local_7a8._32_4_);
      local_7a8._48_4_ = local_7a8._36_4_;
      local_7a8._44_4_ = -2;
      in_stack_fffffffffffff678 = (ActionMessage *)&in_RDI->unknownHandles;
      in_stack_fffffffffffff680 = (CoreBroker *)local_7a8;
      std::
      function<void(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>
      ::function<helics::CoreBroker::executeInitializationOperations(bool)::__7,void>
                ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                  *)in_stack_fffffffffffff660,(anon_class_16_2_f8aac700 *)in_stack_fffffffffffff658)
      ;
      UnknownHandleManager::processNonOptionalUnknowns(this_02,cfunc_01);
      CLI::std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
      ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                   *)0x5e9f5a);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
    }
    bVar1 = false;
  }
  else {
    local_2d8[0] = 0;
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
    local_398 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(local_394,(GlobalBrokerId)local_398);
    local_388 = (float)local_394[0].gid;
    local_38c = 0xfffffffe;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688,
               (allocator<char> *)in_stack_fffffffffffff680);
    std::allocator<char>::~allocator(&local_3b9);
    cfunc = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
             *)&in_RDI->unknownHandles;
    local_3f0 = local_3b8;
    local_3e8 = local_2d8;
    this_00 = (UnknownHandleManager *)&stack0xfffffffffffffc20;
    std::
    function<void(std::__cxx11::string_const&,helics::InterfaceType,std::pair<helics::GlobalHandle,unsigned_short>)>
    ::function<helics::CoreBroker::executeInitializationOperations(bool)::__4,void>
              ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                *)in_stack_fffffffffffff660,(anon_class_16_2_2b372102 *)in_stack_fffffffffffff658);
    UnknownHandleManager::processUnknowns(this_01,cfunc_00);
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                 *)0x5e996c);
    local_420._M_nxt = local_3b8;
    local_418 = local_2d8;
    std::
    function<void(std::__cxx11::string_const&,helics::InterfaceType,std::__cxx11::string_const&,helics::InterfaceType)>
    ::function<helics::CoreBroker::executeInitializationOperations(bool)::__5,void>
              (in_stack_fffffffffffff660,(anon_class_24_3_eb41ddde *)in_stack_fffffffffffff658);
    UnknownHandleManager::processUnknownLinks(this_00,cfunc);
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
                 *)0x5e99e3);
    bVar1 = 0 < local_2d8[0];
    if (bVar1) {
      in_stack_fffffffffffff6b0 = (UnknownHandleManager *)&in_RDI->super_BrokerBase;
      local_430 = 0;
      GlobalFederateId::GlobalFederateId(local_42c,(GlobalBrokerId)0x0);
      in_stack_fffffffffffff6b8 = (UnknownHandleManager *)getIdentifier_abi_cxx11_(in_RDI);
      local_440 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      local_450 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff650);
      in_stack_fffffffffffff648 = (ActionMessage *)local_450._M_len;
      in_stack_fffffffffffff650 = (UnknownHandleManager *)local_450._M_str;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7ac,
                 in_stack_fffffffffffff7b8,in_stack_fffffffffffff8f0,(bool)in_stack_fffffffffffff7ab
                );
      SmallBuffer::operator=
                ((SmallBuffer *)in_stack_fffffffffffff678,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff670);
      local_454.hid = 0;
      InterfaceHandle::InterfaceHandle(&local_454);
      local_37c = local_454.hid;
      broadcast(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
      sendDisconnect(in_stack_fffffffffffff740,disconnectType);
      ActionMessage::ActionMessage
                ((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
      BrokerBase::addActionMessage
                ((BrokerBase *)in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff650);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
    if (!bVar1) goto LAB_005e9c62;
  }
LAB_005e9fa4:
  CLI::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)in_stack_fffffffffffff660);
  if (bVar1) {
    return;
  }
LAB_005e9fd7:
  ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c)
  ;
  local_878 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  GlobalFederateId::GlobalFederateId(local_874,(GlobalBrokerId)local_878);
  local_868 = local_874[0].gid;
  BrokerBase::setBrokerState
            (in_stack_fffffffffffff658,(BrokerState)((ulong)in_stack_fffffffffffff650 >> 0x30));
  broadcast(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  pBVar4 = CLI::std::
           unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         *)0x5ea062);
  (*pBVar4->_vptr_BaseTimeCoordinator[10])(pBVar4,0);
  pBVar4 = CLI::std::
           unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         *)0x5ea086);
  local_880.gid = 0;
  GlobalFederateId::GlobalFederateId(&local_880);
  iVar3 = (*pBVar4->_vptr_BaseTimeCoordinator[9])(pBVar4,(ulong)(uint)local_880.gid);
  local_879 = (char)iVar3;
  if (local_879 == '\0') {
    (in_RDI->super_BrokerBase).enteredExecutionMode = true;
  }
  BrokerBase::logFlush((BrokerBase *)0x5ea118);
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff650);
  return;
}

Assistant:

void CoreBroker::executeInitializationOperations(bool iterating)
{
    if (iterating) {
        ActionMessage init(CMD_INIT_GRANT);
        init.source_id = global_broker_id_local;
        setActionFlag(init, iteration_requested_flag);
        setBrokerState(BrokerState::CONNECTED);
        mBrokers.apply([&init, this](auto& broker) {
            if ((!broker._nonLocal) && (broker.state < ConnectionState::DISCONNECTED)) {
                if (broker.initIterating) {
                    broker.initIterating = false;
                    broker.state = ConnectionState::CONNECTED;
                    init.dest_id = broker.global_id;
                    transmit(broker.route, init);
                }
            }
        });
        initIterating = false;
        return;
    }
    if (brokerKey == universalKey) {
        LOG_SUMMARY(global_broker_id_local, getIdentifier(), "Broker started with universal key");
    }
    checkDependencies();
    if (!mTimeMonitorFederate.empty()) {
        loadTimeMonitor(true, std::string_view{});
    }
    if (unknownHandles.hasUnknowns()) {
        unknownHandles.processUnknownLinks([this](const std::string& origin,
                                                  InterfaceType originType,
                                                  const std::string& target,
                                                  InterfaceType targetType) {
            const auto* originHandle = handles.getInterfaceHandle(origin, originType);
            if (originHandle != nullptr) {
                const auto* targetHandle = handles.getInterfaceHandle(target, targetType);
                if (targetHandle != nullptr) {
                    if (originType == InterfaceType::PUBLICATION) {
                        ActionMessage datalink(CMD_DATA_LINK);
                        datalink.name(originHandle->key);
                        datalink.setString(targetStringLoc, targetHandle->key);
                        linkInterfaces(datalink);
                    } else if (originType == InterfaceType::ENDPOINT &&
                               targetType == InterfaceType::ENDPOINT) {
                        ActionMessage eptlink(CMD_ENDPOINT_LINK);
                        eptlink.name(originHandle->key);
                        eptlink.setString(targetStringLoc, targetHandle->key);
                        linkInterfaces(eptlink);
                    }
                    // TODO(PT):: make this work for filters
                }
            }
        });
        std::vector<std::vector<std::string>> foundAliasHandles;
        foundAliasHandles.resize(4);
        bool useRegex{false};
        unknownHandles.processUnknowns(
            [this, &foundAliasHandles, &useRegex](const std::string& target,
                                                  InterfaceType type,
                                                  UnknownHandleManager::TargetInfo /*target*/) {
                const auto* info = handles.getInterfaceHandle(target, type);
                if (info == nullptr) {
                    if (!useRegex) {
                        if (target.compare(0, 6, regexKey) == 0) {
                            useRegex = true;
                        }
                    }
                    return;
                }
                switch (type) {
                    case InterfaceType::PUBLICATION:
                        foundAliasHandles[0].emplace_back(target);
                        break;
                    case InterfaceType::INPUT:
                        foundAliasHandles[1].emplace_back(target);
                        break;
                    case InterfaceType::ENDPOINT:
                        foundAliasHandles[2].emplace_back(target);
                        break;
                    case InterfaceType::FILTER:
                        foundAliasHandles[3].emplace_back(target);
                        break;
                    default:
                        break;
                }
            });
        if (!foundAliasHandles[0].empty()) {
            for (const auto& target : foundAliasHandles[0]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::PUBLICATION);
                findAndNotifyPublicationTargets(*info, target);
            }
        }
        if (!foundAliasHandles[1].empty()) {
            for (const auto& target : foundAliasHandles[1]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::INPUT);
                findAndNotifyInputTargets(*info, target);
            }
        }
        if (!foundAliasHandles[2].empty()) {
            for (const auto& target : foundAliasHandles[2]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::ENDPOINT);
                findAndNotifyEndpointTargets(*info, target);
            }
        }
        if (!foundAliasHandles[3].empty()) {
            for (const auto& target : foundAliasHandles[3]) {
                auto* info = handles.getInterfaceHandle(target, InterfaceType::FILTER);
                findAndNotifyFilterTargets(*info, target);
            }
        }
        if (useRegex) {
            unknownHandles.processUnknowns([this](const std::string& target,
                                                  InterfaceType type,
                                                  UnknownHandleManager::TargetInfo tinfo) {
                if (target.compare(0, 6, regexKey) == 0) {
                    findRegexMatch(target, type, tinfo.first, tinfo.second);
                }
            });
            unknownHandles.clearUnknownsIf([](const std::string& target,
                                              InterfaceType /*type*/,
                                              UnknownHandleManager::TargetInfo /*tinfo*/) {
                return (target.compare(0, 6, regexKey) == 0);
            });
        }
        /** now do a check on the unknownLinks*/

        if (errorOnUnmatchedConnections) {
            if (unknownHandles.hasUnknowns()) {
                int unmatchedCount{0};
                ActionMessage eMiss(CMD_ERROR);
                eMiss.source_id = global_broker_id_local;
                eMiss.messageID = defs::Errors::CONNECTION_FAILURE;
                std::string errorString{"unmatched connections"};

                unknownHandles.processUnknowns(
                    [&errorString, &unmatchedCount](const std::string& target,
                                                    InterfaceType type,
                                                    UnknownHandleManager::TargetInfo /*tinfo*/) {
                        errorString.append(fmt::format("\nUnable to connect {} to target {}",
                                                       interfaceTypeName(type),
                                                       target));
                        ++unmatchedCount;
                    });

                unknownHandles.processUnknownLinks(
                    [this, &errorString, &unmatchedCount](const std::string& origin,
                                                          InterfaceType originType,
                                                          const std::string& target,
                                                          InterfaceType targetType) {
                        const auto* originHandle = handles.getInterfaceHandle(origin, originType);
                        if (originHandle != nullptr) {
                            const auto* targetHandle =
                                handles.getInterfaceHandle(target, targetType);
                            if (targetHandle != nullptr) {
                                return;
                            }
                        }
                        ++unmatchedCount;
                        errorString.append(
                            fmt::format("\nUnable to make link between {} and {}", origin, target));
                    });
                if (unmatchedCount > 0) {
                    LOG_ERROR(parent_broker_id, getIdentifier(), errorString);
                    eMiss.payload = errorString;
                    eMiss.dest_handle = InterfaceHandle{};
                    broadcast(eMiss);
                    sendDisconnect(CMD_GLOBAL_DISCONNECT);
                    addActionMessage(CMD_STOP);
                    return;
                }
            }
        }
        if (unknownHandles.hasNonOptionalUnknowns()) {
            if (unknownHandles.hasRequiredUnknowns()) {
                ActionMessage eMiss(CMD_ERROR);
                eMiss.source_id = global_broker_id_local;
                eMiss.messageID = defs::Errors::CONNECTION_FAILURE;
                unknownHandles.processRequiredUnknowns(
                    [this, &eMiss](const std::string& target,
                                   InterfaceType type,
                                   UnknownHandleManager::TargetInfo tinfo) {
                        eMiss.payload = fmt::format("Unable to connect to required {} target {}",
                                                    interfaceTypeName(type),
                                                    target);
                        LOG_ERROR(parent_broker_id, getIdentifier(), eMiss.payload.to_string());

                        eMiss.setDestination(tinfo.first);
                        routeMessage(eMiss);
                    });
                eMiss.payload = "Missing required connections";
                eMiss.dest_handle = InterfaceHandle{};
                broadcast(eMiss);
                sendDisconnect(CMD_GLOBAL_DISCONNECT);
                addActionMessage(CMD_STOP);
                return;
            }
            ActionMessage wMiss(CMD_WARNING);
            wMiss.source_id = global_broker_id_local;
            wMiss.messageID = defs::Errors::CONNECTION_FAILURE;
            unknownHandles.processNonOptionalUnknowns(
                [this, &wMiss](const std::string& target,
                               InterfaceType type,
                               UnknownHandleManager::TargetInfo tinfo) {
                    wMiss.payload = fmt::format("Unable to connect to {} target {}",
                                                interfaceTypeName(type),
                                                target);
                    LOG_WARNING(parent_broker_id, getIdentifier(), wMiss.payload.to_string());

                    wMiss.setDestination(tinfo.first);
                    routeMessage(wMiss);
                });
        }
    }

    ActionMessage init(CMD_INIT_GRANT);
    init.source_id = global_broker_id_local;
    setBrokerState(BrokerState::OPERATING);
    broadcast(init);
    timeCoord->enteringExecMode();
    auto res = timeCoord->checkExecEntry();
    if (res == MessageProcessingResult::NEXT_STEP) {
        enteredExecutionMode = true;
    }
    logFlush();
}